

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

int main(int param_1,char **param_2)

{
  int iVar1;
  ostream *poVar2;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Hello from the second CMake example!");
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"Version = ");
  iVar1 = examples::getVersion();
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
  std::endl<char,std::char_traits<char>>(poVar2);
  return 0;
}

Assistant:

int main(int, char**) {

    std::cout << "Hello from the second CMake example!" << std::endl;
    std::cout << "Version = " << examples::getVersion() << std::endl;

    return 0;
}